

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  char *pcVar1;
  Offset OVar2;
  tuple<wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_> tVar3;
  size_t sVar4;
  undefined1 auStack_c8 [8];
  Location loc_1;
  string_view name_local;
  Location loc;
  tuple<wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_> local_48;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> field;
  
  name_local.data_ = (char *)name.size_;
  loc_1.field_1._8_8_ = name.data_;
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  name_local.size_ = 0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  pcVar1 = this->filename_;
  sVar4 = strlen(pcVar1);
  loc.filename.data_._0_4_ = (undefined4)sVar4;
  loc.filename.data_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar2;
  loc.filename.size_._4_4_ = (undefined4)(OVar2 >> 0x20);
  name_local.size_ = (size_type)pcVar1;
  MakeUnique<wabt::ExportModuleField,wabt::Location>
            ((wabt *)&local_48,(Location *)&name_local.size_);
  tVar3.
  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>)
       (_Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>)
       local_48;
  string_view::to_string_abi_cxx11_
            ((string *)&name_local.size_,(string_view *)((long)&loc_1.field_1 + 8));
  std::__cxx11::string::operator=
            ((string *)
             ((long)tVar3.
                    super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                    .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x40),
             (string *)&name_local.size_);
  if ((size_type *)name_local.size_ != &loc.filename.size_) {
    operator_delete((void *)name_local.size_);
  }
  switch(kind) {
  case First:
    if ((ulong)((long)(this->module_->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)item_index) {
      __assert_fail("item_index < module_->funcs.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x220,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Table:
    if ((ulong)((long)(this->module_->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)item_index) {
      __assert_fail("item_index < module_->tables.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x223,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Memory:
    if ((ulong)((long)(this->module_->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)item_index) {
      __assert_fail("item_index < module_->memories.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x226,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Global:
    if ((ulong)((long)(this->module_->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)item_index) {
      __assert_fail("item_index < module_->globals.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x229,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
  }
  loc_1.filename.size_._0_4_ = 0;
  loc_1.filename.size_._4_4_ = 0;
  loc_1.field_1.field_0.line = 0;
  auStack_c8 = (undefined1  [8])0x0;
  loc_1.filename.data_._0_4_ = 0;
  loc_1.filename.data_._4_4_ = 0;
  pcVar1 = this->filename_;
  sVar4 = strlen(pcVar1);
  loc_1.filename.data_._0_4_ = (undefined4)sVar4;
  loc_1.filename.data_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.filename.size_._0_4_ = (undefined4)OVar2;
  loc_1.filename.size_._4_4_ = (undefined4)(OVar2 >> 0x20);
  auStack_c8 = (undefined1  [8])pcVar1;
  Var::Var((Var *)&name_local.size_,item_index,(Location *)auStack_c8);
  Var::operator=(&((Export *)
                  ((long)tVar3.
                         super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                         .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl +
                  0x40))->var,(Var *)&name_local.size_);
  Var::~Var((Var *)&name_local.size_);
  ((Export *)
  ((long)tVar3.
         super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
         .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x40))->kind = kind
  ;
  field._M_t.
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>,_true,_true>
          )local_48.
           super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
           .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  local_48.
  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>)
       (_Head_base<0UL,_wabt::ExportModuleField_*,_false>)0x0;
  Module::AppendField(this->module_,&field);
  if ((__uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>)
      field._M_t.
      super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>.
      _M_t.
      super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
      .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>)0x0)
  {
    (**(code **)(*(long *)field._M_t.
                          super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  field._M_t.
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>,_true,_true>
        )(__uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>)
         0x0;
  if (local_48.
      super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
      .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::ExportModuleField_*,_false>)0x0) {
    (**(code **)(*(long *)local_48.
                          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                string_view name) {
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name.to_string();
  switch (kind) {
    case ExternalKind::Func:
      assert(item_index < module_->funcs.size());
      break;
    case ExternalKind::Table:
      assert(item_index < module_->tables.size());
      break;
    case ExternalKind::Memory:
      assert(item_index < module_->memories.size());
      break;
    case ExternalKind::Global:
      assert(item_index < module_->globals.size());
      break;
    case ExternalKind::Except:
      // Note: Can't check if index valid, exceptions section comes later.
      break;
  }
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}